

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall
SmallArray<ExpressionEvalContext::StackVariable,_32U>::grow
          (SmallArray<ExpressionEvalContext::StackVariable,_32U> *this,uint newSize)

{
  StackVariable *pSVar1;
  uint local_24;
  StackVariable *pSStack_20;
  uint i;
  StackVariable *newData;
  uint newSize_local;
  SmallArray<ExpressionEvalContext::StackVariable,_32U> *this_local;
  
  if (newSize < this->max + (this->max >> 1)) {
    newData._4_4_ = this->max + (this->max >> 1);
  }
  else {
    newData._4_4_ = newSize + 4;
  }
  if (this->allocator == (Allocator *)0x0) {
    pSStack_20 = NULLC::construct<ExpressionEvalContext::StackVariable>(newData._4_4_);
  }
  else {
    pSStack_20 = Allocator::construct<ExpressionEvalContext::StackVariable>
                           (this->allocator,newData._4_4_);
  }
  for (local_24 = 0; local_24 < this->count; local_24 = local_24 + 1) {
    pSVar1 = this->data;
    pSStack_20[local_24].variable = pSVar1[local_24].variable;
    pSStack_20[local_24].ptr = pSVar1[local_24].ptr;
  }
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<ExpressionEvalContext::StackVariable>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<ExpressionEvalContext::StackVariable>
                (this->allocator,this->data,(ulong)this->max);
    }
  }
  this->data = pSStack_20;
  this->max = newData._4_4_;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}